

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void map_evacuate(void *map_evacuate_void)

{
  long lVar1;
  World *pWVar2;
  size_type sVar3;
  int iVar4;
  mapped_type *pmVar5;
  long *plVar6;
  long *plVar7;
  _Alloc_hider _Var8;
  Character *this;
  char *__end;
  vector<Character_*,_std::allocator<Character_*>_> evac_chars;
  Character *character;
  key_type local_b8;
  int local_94;
  undefined1 local_90 [32];
  undefined8 *local_70;
  int local_68;
  int local_64;
  Character *local_60;
  long *local_58;
  string local_50;
  
  lVar1 = **map_evacuate_void;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"EvacuateStep","");
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(lVar1 + 0x198),&local_b8);
  iVar4 = util::variant::GetInt(pmVar5);
  lVar1 = **map_evacuate_void;
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"EvacuateTick","");
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(lVar1 + 0x198),(key_type *)local_90);
  local_94 = util::variant::GetInt(pmVar5);
  local_94 = iVar4 / local_94;
  if ((Character *)local_90._0_8_ != (Character *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar4 = *(int *)((long)map_evacuate_void + 8);
  if (iVar4 < 1) {
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = 0;
    plVar6 = *(long **)(*map_evacuate_void + 0x20);
    plVar7 = (long *)(*map_evacuate_void + 0x20);
    if (plVar6 != plVar7) {
      do {
        local_90._0_8_ = plVar6[2];
        iVar4 = (**(((Character *)local_90._0_8_)->super_Command_Source)._vptr_Command_Source)();
        if ((char)iVar4 == '\0') {
          if (local_b8._M_string_length == local_b8.field_2._M_allocated_capacity) {
            std::vector<Character*,std::allocator<Character*>>::_M_realloc_insert<Character*const&>
                      ((vector<Character*,std::allocator<Character*>> *)&local_b8,
                       (iterator)local_b8._M_string_length,(Character **)local_90);
          }
          else {
            *(undefined8 *)local_b8._M_string_length = local_90._0_8_;
            local_b8._M_string_length = local_b8._M_string_length + 8;
          }
        }
        sVar3 = local_b8._M_string_length;
        plVar6 = (long *)*plVar6;
        _Var8._M_p = local_b8._M_dataplus._M_p;
      } while (plVar6 != plVar7);
      for (; _Var8._M_p != (pointer)sVar3; _Var8._M_p = (pointer)((long)_Var8._M_p + 8)) {
        World::Jail((*(Character **)_Var8._M_p)->world,(Command_Source *)0x0,
                    *(Character **)_Var8._M_p,false);
      }
    }
    *(undefined1 *)(*map_evacuate_void + 200) = 0;
    operator_delete(map_evacuate_void,0x10);
    if ((Character **)local_b8._M_dataplus._M_p != (Character **)0x0) {
      operator_delete(local_b8._M_dataplus._M_p,
                      local_b8.field_2._M_allocated_capacity - (long)local_b8._M_dataplus._M_p);
    }
  }
  else {
    local_68 = iVar4 % local_94;
    plVar6 = *(long **)(*map_evacuate_void + 0x20);
    local_58 = (long *)(*map_evacuate_void + 0x20);
    local_70 = (undefined8 *)map_evacuate_void;
    if (plVar6 != local_58) {
      do {
        this = (Character *)plVar6[2];
        if (local_68 == 0) {
          pWVar2 = this->world;
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          local_60 = this;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"map_evacuate","");
          iVar4 = *(int *)(local_70 + 1) / local_94;
          lVar1 = *(long *)*local_70;
          local_90._0_8_ = local_90 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"EvacuateStep","");
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)(lVar1 + 0x198),(key_type *)local_90);
          local_64 = util::variant::GetInt(pmVar5);
          local_64 = local_64 * iVar4;
          I18N::Format<int>(&local_50,&pWVar2->i18n,&local_b8,&local_64);
          this = local_60;
          (*(local_60->super_Command_Source)._vptr_Command_Source[5])(local_60,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((Character *)local_90._0_8_ != (Character *)(local_90 + 0x10)) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        lVar1 = *(long *)*local_70;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"EvacuateSound","");
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)(lVar1 + 0x198),&local_b8);
        iVar4 = util::variant::GetInt(pmVar5);
        Character::PlaySound(this,(uchar)iVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        plVar6 = (long *)*plVar6;
      } while (plVar6 != local_58);
      iVar4 = *(int *)(local_70 + 1);
      map_evacuate_void = local_70;
    }
    *(int *)((long)map_evacuate_void + 8) = iVar4 + -1;
  }
  return;
}

Assistant:

void map_evacuate(void *map_evacuate_void)
{
	map_evacuate_struct *evac(static_cast<map_evacuate_struct *>(map_evacuate_void));

	int ticks_per_step = int(evac->map->world->config["EvacuateStep"]) / int(evac->map->world->config["EvacuateTick"]);

	if (evac->step > 0)
	{
		bool step = evac->step % ticks_per_step == 0;

		UTIL_FOREACH(evac->map->characters, character)
		{
			if (step)
				character->ServerMsg(character->world->i18n.Format("map_evacuate", (evac->step / ticks_per_step) * int(evac->map->world->config["EvacuateStep"])));

			character->PlaySound(int(evac->map->world->config["EvacuateSound"]));
		}

		--evac->step;
	}
	else
	{
		std::vector<Character*> evac_chars;

		UTIL_FOREACH(evac->map->characters, character)
		{
			if (character->SourceAccess() < ADMIN_GUIDE)
			{
				evac_chars.push_back(character);
			}
		}

		UTIL_FOREACH(evac_chars, character)
		{
			character->world->Jail(0, character, false);
		}

		evac->map->evacuate_lock = false;
		delete evac;
	}
}